

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * __thiscall
QLocaleData::unsLongLongToString
          (QLocaleData *this,qulonglong l,int precision,int base,int width,uint flags)

{
  long lVar1;
  QStringView zero_00;
  int in_ECX;
  QStringView *in_RDX;
  QString *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  char16_t *str;
  int in_stack_0000008c;
  int in_stack_000000a0;
  uint in_stack_000000a8;
  QString resultZero;
  QString zero;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QString *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QString *pQVar2;
  QString *in_stack_ffffffffffffff70;
  QLocaleData *in_stack_ffffffffffffff78;
  QArrayDataPointer<char16_t> local_50;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  storage_type_conflict *psVar3;
  undefined1 *puVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar3 = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  puVar4 = &DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = in_RDI;
  zeroDigit((QLocaleData *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  if (in_R8D == 10) {
    QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  else {
    in_stack_ffffffffffffff78 = (QLocaleData *)0x24307c;
    in_stack_ffffffffffffff70 = (QString *)0x24307c;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_50,(Data *)0x0,L"0",1);
    QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (DataPointer *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
  }
  if (in_RDX == (QStringView *)0x0) {
    QString::QString((QString *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     (QString *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  }
  else {
    QStringView::QStringView<QString,_true>(in_RDX,in_stack_ffffffffffffff18);
    zero_00.m_size = (qsizetype)puVar4;
    zero_00.m_data = psVar3;
    qulltoa((qulonglong)in_RDX,in_ECX,zero_00);
  }
  applyIntegerFormatting
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,SUB81((ulong)pQVar2 >> 0x38,0),
             (int)pQVar2,in_stack_0000008c,in_stack_000000a0,in_stack_000000a8);
  QString::~QString((QString *)0x1c7ee2);
  QString::~QString((QString *)0x1c7eef);
  QString::~QString((QString *)0x1c7efc);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QLocaleData::unsLongLongToString(qulonglong l, int precision,
                                         int base, int width, unsigned flags) const
{
    const QString zero = zeroDigit();
    QString resultZero = base == 10 ? zero : QStringLiteral("0");
    return applyIntegerFormatting(l ? qulltoa(l, base, zero) : resultZero,
                                  false, precision, base, width, flags);
}